

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void * mg_get_thread_pointer(mg_connection *conn)

{
  void *pvVar1;
  void **ppvVar2;
  
  if (conn == (mg_connection *)0x0) {
    pvVar1 = pthread_getspecific(sTlsKey);
    ppvVar2 = (void **)((long)pvVar1 + 0x10);
  }
  else {
    ppvVar2 = &conn->tls_user_ptr;
  }
  return *ppvVar2;
}

Assistant:

CIVETWEB_API void *
mg_get_thread_pointer(const struct mg_connection *conn)
{
	/* both methods should return the same pointer */
	if (conn) {
		/* quick access, in case conn is known */
		return conn->tls_user_ptr;
	} else {
		/* otherwise get pointer from thread local storage (TLS) */
		struct mg_workerTLS *tls =
		    (struct mg_workerTLS *)pthread_getspecific(sTlsKey);
		return tls->user_ptr;
	}
}